

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementHexaANCF_3813::ComputeMassMatrix(ChElementHexaANCF_3813 *this)

{
  ChMatrixNM<double,_24,_24> *this_00;
  double rho;
  Brick_Mass myformula;
  double local_408;
  Brick_Mass local_400;
  
  local_408 = (((this->m_Material).
                super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChContinuumMaterial).density;
  Brick_Mass::Brick_Mass(&local_400,&this->m_d0,this);
  this_00 = &this->m_MassMatrix;
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)this_00);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,24,24,1,24,24>>
            (this_00,&local_400.super_ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,-1.0
             ,1.0,-1.0,1.0,-1.0,1.0,2);
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)this_00,&local_408);
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeMassMatrix() {
    double rho = m_Material->Get_density();
    Brick_Mass myformula(&m_d0, this);
    m_MassMatrix.setZero();
    ChQuadrature::Integrate3D<ChMatrixNM<double, 24, 24>>(m_MassMatrix,  // result of integration will go there
                                                          myformula,     // formula to integrate
                                                          -1,            // start of x
                                                          1,             // end of x
                                                          -1,            // start of y
                                                          1,             // end of y
                                                          -1,            // start of z
                                                          1,             // end of z
                                                          2              // order of integration
    );

    m_MassMatrix *= rho;
}